

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

void __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::Initialize(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
             *this)

{
  HeapAllocator *this_00;
  Memory *this_01;
  SimpleHashEntry<Js::JavascriptPromise_*,_int> **ppSVar1;
  char *name;
  DictionaryStats *pDVar2;
  TrackAllocData local_38;
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  *local_10;
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  *this_local;
  
  this->disableResize = false;
  this->free = (EntryType *)0x0;
  this_00 = this->allocator;
  local_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&SimpleHashEntry<Js::JavascriptPromise*,int>*::typeinfo,0,
             (ulong)this->size,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SimpleHashTable.h"
             ,0x41);
  this_01 = (Memory *)Memory::HeapAllocator::TrackAllocInfo(this_00,&local_38);
  ppSVar1 = Memory::
            AllocateArray<Memory::HeapAllocator,SimpleHashEntry<Js::JavascriptPromise*,int>*,false>
                      (this_01,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,(ulong)this->size
                      );
  this->table = ppSVar1;
  name = std::type_info::name
                   ((type_info *)
                    &SimpleHashTable<Js::JavascriptPromise*,int,Memory::HeapAllocator,DefaultComparer,false,PowerOf2Policy>*
                     ::typeinfo);
  pDVar2 = DictionaryStats::Create(name,this->size);
  this->stats = pDVar2;
  return;
}

Assistant:

void Initialize()
    {
        disableResize = false;
        free = nullptr;
        table = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, size);
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
    }